

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O0

Error __thiscall asmjit::v1_14::String::_opChars(String *this,ModifyOp op,char c,size_t n)

{
  char *__s;
  size_t in_RCX;
  byte in_DL;
  char *p;
  undefined3 in_stack_00000020;
  undefined4 local_4;
  
  if (in_RCX == 0) {
    local_4 = 0;
  }
  else {
    __s = prepare((String *)CONCAT44(op,_in_stack_00000020),n._4_4_,(size_t)p);
    if (__s == (char *)0x0) {
      local_4 = DebugUtils::errored(1);
    }
    else {
      memset(__s,(uint)in_DL,in_RCX);
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

Error String::_opChars(ModifyOp op, char c, size_t n) noexcept {
  if (!n)
    return kErrorOk;

  char* p = prepare(op, n);
  if (!p)
    return DebugUtils::errored(kErrorOutOfMemory);

  memset(p, c, n);
  return kErrorOk;
}